

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_157::TranslateToExnref::doWalkFunction(TranslateToExnref *this,Function *func)

{
  bool bVar1;
  TargetTryLabelScanner *pTVar2;
  LabelManager *this_00;
  mapped_type *this_01;
  string_view sVar3;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_428;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_420;
  string local_418;
  string_view local_3f8;
  IString *local_3e8;
  Name *target;
  iterator __end2;
  iterator __begin2;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2;
  enable_if_t<is_constructible_v<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Function_*&,_wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner_*>,_optional<ExnrefLocalAssigner>_>
  local_3c0;
  enable_if_t<is_constructible_v<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Function_*&>,_optional<TargetTryLabelScanner>_>
  local_280;
  enable_if_t<is_constructible_v<wasm::LabelUtils::LabelManager,_wasm::Function_*&>,_optional<LabelManager>_>
  local_130;
  Function *local_18;
  Function *func_local;
  TranslateToExnref *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  std::make_optional<wasm::LabelUtils::LabelManager,wasm::Function*&>(&local_130,&local_18);
  std::optional<wasm::LabelUtils::LabelManager>::operator=(&this->labels,&local_130);
  std::optional<wasm::LabelUtils::LabelManager>::~optional(&local_130);
  std::
  make_optional<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,wasm::Function*&>
            (&local_280,&local_18);
  std::optional<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>::operator=
            (&this->labelScanner,&local_280);
  std::optional<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>::~optional
            (&local_280);
  __range2 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
             std::optional<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>::
             value(&this->labelScanner);
  std::
  make_optional<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,wasm::Function*&,wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner*>
            (&local_3c0,&local_18,(TargetTryLabelScanner **)&__range2);
  std::optional<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>::operator=
            (&this->localAssigner,&local_3c0);
  std::optional<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>::~optional
            (&local_3c0);
  pTVar2 = std::optional<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>::
           operator->(&this->labelScanner);
  __end2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                     (&pTVar2->delegateTargets);
  target = (Name *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                             (&pTVar2->delegateTargets);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&target);
    if (!bVar1) break;
    local_3e8 = &std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2)->super_IString;
    this_00 = std::optional<wasm::LabelUtils::LabelManager>::operator->(&this->labels);
    IString::toString_abi_cxx11_(&local_418,local_3e8);
    sVar3 = (string_view)LabelUtils::LabelManager::getUnique(this_00,&local_418);
    local_3f8 = sVar3;
    this_01 = std::
              unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::operator[](&this->delegateTargetToTrampoline,(key_type *)local_3e8);
    wasm::Name::operator=(this_01,(Name *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2);
  }
  Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
  ::doWalkFunction(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
                    ).
                    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                   ,local_18);
  local_420._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::find(&this->delegateTargetToTrampoline,(key_type *)&DELEGATE_CALLER_TARGET);
  local_428._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::end(&this->delegateTargetToTrampoline);
  bVar1 = std::__detail::operator!=(&local_420,&local_428);
  if (bVar1) {
    processCallerDelegateTarget(this);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    labels = std::make_optional<LabelUtils::LabelManager>(func);
    labelScanner = std::make_optional<TargetTryLabelScanner>(func);
    localAssigner =
      std::make_optional<ExnrefLocalAssigner>(func, &labelScanner.value());

    // Create a unique br target label for each existing delegate target label,
    // because we are going to achieve 'delegate's effects with 'br's. See
    // processDelegateTarget() for details.
    for (auto& target : labelScanner->delegateTargets) {
      delegateTargetToTrampoline[target] = labels->getUnique(target.toString());
    }

    Super::doWalkFunction(func);

    // Similar to processDelegateTarget(), but for the caller target.
    if (delegateTargetToTrampoline.find(DELEGATE_CALLER_TARGET) !=
        delegateTargetToTrampoline.end()) {
      processCallerDelegateTarget();
    }
  }